

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbs(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *__return_storage_ptr__,
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  undefined8 *puVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  type_conflict5 tVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RDX_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  ulong uVar4;
  long lVar5;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined1 local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined1 local_94;
  undefined8 local_90;
  type local_80;
  
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&__return_storage_ptr__->m_backend,0,(type *)0x0);
  uVar4 = (ulong)(uint)this->memused;
  lVar5 = uVar4 * 0x54 + -0xc;
  arg_00 = extraout_RDX;
  for (; 0 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
    pNVar2 = this->m_elem;
    puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -0x48);
    local_d8 = *puVar1;
    uStack_d0 = puVar1[1];
    puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -0x38);
    local_c8 = *puVar1;
    uStack_c0 = puVar1[1];
    puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -0x28);
    local_b8 = *puVar1;
    uStack_b0 = puVar1[1];
    puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -0x18);
    local_a8 = *puVar1;
    uStack_a0 = puVar1[1];
    local_98 = *(undefined4 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -8);
    local_94 = *(undefined1 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -4);
    local_90 = *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5);
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_80,(multiprecision *)&local_d8,arg_00);
    tVar3 = boost::multiprecision::operator>(&local_80,__return_storage_ptr__);
    arg_00 = arg;
    if (tVar3) {
      pNVar2 = this->m_elem;
      puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -0x48);
      local_128 = *puVar1;
      uStack_120 = puVar1[1];
      puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -0x38);
      local_118 = *puVar1;
      uStack_110 = puVar1[1];
      puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -0x28);
      local_108 = *puVar1;
      uStack_100 = puVar1[1];
      puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -0x18);
      local_f8 = *puVar1;
      uStack_f0 = puVar1[1];
      local_e8 = *(undefined4 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -8);
      local_e4 = *(undefined1 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5 + -4);
      local_e0 = *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar5);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_80,(multiprecision *)&local_128,arg);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
           local_80.m_backend.data._M_elems._48_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
           local_80.m_backend.data._M_elems._56_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
           local_80.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
           local_80.m_backend.data._M_elems._40_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
           local_80.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
           local_80.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
           local_80.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
           local_80.m_backend.data._M_elems._8_8_;
      (__return_storage_ptr__->m_backend).exp = local_80.m_backend.exp;
      (__return_storage_ptr__->m_backend).neg = local_80.m_backend.neg;
      (__return_storage_ptr__->m_backend).fpclass = local_80.m_backend.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = local_80.m_backend.prec_elem;
      arg_00 = extraout_RDX_00;
    }
    lVar5 = lVar5 + -0x54;
  }
  return __return_storage_ptr__;
}

Assistant:

R maxAbs() const
   {
      R maxi = 0;

      for(int i = size() - 1; i >= 0; --i)
      {
         if(spxAbs(m_elem[i].val) > maxi)
            maxi = spxAbs(m_elem[i].val);
      }

      assert(maxi >= 0);

      return maxi;
   }